

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O0

bool __thiscall
File::writeAttributeMap
          (File *this,
          map<unsigned_long,_OSAttribute,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute>_>_>
          *value)

{
  bool bVar1;
  undefined1 uVar2;
  size_t sVar3;
  size_type sVar4;
  long in_RDI;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> val_5;
  unsigned_long attrKind_3;
  ByteString val_4;
  unsigned_long attrKind_2;
  unsigned_long val_3;
  unsigned_long attrKind_1;
  bool val_2;
  unsigned_long attrKind;
  unsigned_long attrType;
  OSAttribute attr_1;
  const_iterator i_1;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> val_1;
  ByteString val;
  OSAttribute attr;
  const_iterator i;
  unsigned_long len;
  undefined7 in_stack_fffffffffffffcf8;
  undefined1 in_stack_fffffffffffffcff;
  OSAttribute *in_stack_fffffffffffffd00;
  undefined5 in_stack_fffffffffffffd08;
  undefined1 in_stack_fffffffffffffd0d;
  undefined1 in_stack_fffffffffffffd0e;
  undefined1 in_stack_fffffffffffffd0f;
  ByteString *in_stack_fffffffffffffd10;
  undefined5 in_stack_fffffffffffffd18;
  undefined1 in_stack_fffffffffffffd1d;
  undefined1 in_stack_fffffffffffffd1f;
  undefined2 in_stack_fffffffffffffd28;
  undefined1 in_stack_fffffffffffffd2a;
  undefined1 in_stack_fffffffffffffd2b;
  undefined1 in_stack_fffffffffffffd2c;
  undefined1 in_stack_fffffffffffffd2d;
  undefined1 in_stack_fffffffffffffd2e;
  undefined1 in_stack_fffffffffffffd2f;
  OSAttribute *in_stack_fffffffffffffd30;
  OSAttribute *this_00;
  undefined6 in_stack_fffffffffffffd60;
  undefined1 in_stack_fffffffffffffd66;
  undefined1 in_stack_fffffffffffffd67;
  OSAttribute *in_stack_fffffffffffffd68;
  OSAttribute local_1f0;
  _Self local_150;
  undefined1 local_148 [280];
  _Self local_30;
  _Self local_28;
  long local_20;
  byte local_1;
  
  if ((*(byte *)(in_RDI + 0x28) & 1) == 0) {
    local_1 = 0;
  }
  else {
    local_20 = 0;
    local_28._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_OSAttribute,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute>_>_>
         ::begin((map<unsigned_long,_OSAttribute,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute>_>_>
                  *)CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8));
    while( true ) {
      local_30._M_node =
           (_Base_ptr)
           std::
           map<unsigned_long,_OSAttribute,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute>_>_>
           ::end((map<unsigned_long,_OSAttribute,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute>_>_>
                  *)CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8));
      bVar1 = std::operator!=(&local_28,&local_30);
      if (!bVar1) break;
      std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_OSAttribute>_>::operator->
                ((_Rb_tree_const_iterator<std::pair<const_unsigned_long,_OSAttribute>_> *)0x15b96b);
      in_stack_fffffffffffffd68 = (OSAttribute *)(local_148 + 0x78);
      OSAttribute::OSAttribute
                (in_stack_fffffffffffffd30,
                 (OSAttribute *)
                 CONCAT17(in_stack_fffffffffffffd2f,
                          CONCAT16(in_stack_fffffffffffffd2e,
                                   CONCAT15(in_stack_fffffffffffffd2d,
                                            CONCAT14(in_stack_fffffffffffffd2c,
                                                     CONCAT13(in_stack_fffffffffffffd2b,
                                                              CONCAT12(in_stack_fffffffffffffd2a,
                                                                       in_stack_fffffffffffffd28))))
                                  )));
      local_20 = local_20 + 0x10;
      bVar1 = OSAttribute::isBooleanAttribute(in_stack_fffffffffffffd68);
      if (bVar1) {
        local_20 = local_20 + 1;
LAB_0015bb5b:
        local_148._12_4_ = 0;
      }
      else {
        in_stack_fffffffffffffd67 =
             OSAttribute::isUnsignedLongAttribute((OSAttribute *)(local_148 + 0x78));
        if ((bool)in_stack_fffffffffffffd67) {
          local_20 = local_20 + 8;
          goto LAB_0015bb5b;
        }
        in_stack_fffffffffffffd66 =
             OSAttribute::isByteStringAttribute((OSAttribute *)(local_148 + 0x78));
        if ((bool)in_stack_fffffffffffffd66) {
          OSAttribute::getByteStringValue((OSAttribute *)(local_148 + 0x78));
          ByteString::ByteString
                    (in_stack_fffffffffffffd10,
                     (ByteString *)
                     CONCAT17(in_stack_fffffffffffffd0f,
                              CONCAT16(in_stack_fffffffffffffd0e,
                                       CONCAT15(in_stack_fffffffffffffd0d,in_stack_fffffffffffffd08)
                                      )));
          sVar3 = ByteString::size((ByteString *)0x15ba6f);
          local_20 = sVar3 + 8 + local_20;
          ByteString::~ByteString((ByteString *)0x15ba9c);
          goto LAB_0015bb5b;
        }
        bVar1 = OSAttribute::isMechanismTypeSetAttribute((OSAttribute *)(local_148 + 0x78));
        if (bVar1) {
          OSAttribute::getMechanismTypeSetValue((OSAttribute *)(local_148 + 0x78));
          std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::set
                    ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *
                     )in_stack_fffffffffffffd00,
                     (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *
                     )CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8));
          sVar4 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                  ::size((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                          *)0x15bb19);
          local_20 = sVar4 * 8 + 8 + local_20;
          std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::~set
                    ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *
                     )0x15bb3e);
          goto LAB_0015bb5b;
        }
        local_1 = 0;
        local_148._12_4_ = 1;
      }
      OSAttribute::~OSAttribute(in_stack_fffffffffffffd00);
      if (local_148._12_4_ != 0) goto LAB_0015c0d0;
      std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_OSAttribute>_>::operator++
                ((_Rb_tree_const_iterator<std::pair<const_unsigned_long,_OSAttribute>_> *)
                 in_stack_fffffffffffffd00);
    }
    bVar1 = writeULong((File *)in_stack_fffffffffffffd68,
                       CONCAT17(in_stack_fffffffffffffd67,
                                CONCAT16(in_stack_fffffffffffffd66,in_stack_fffffffffffffd60)));
    if (bVar1) {
      local_148._0_8_ =
           std::
           map<unsigned_long,_OSAttribute,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute>_>_>
           ::begin((map<unsigned_long,_OSAttribute,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute>_>_>
                    *)CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8));
      while( true ) {
        local_150._M_node =
             (_Base_ptr)
             std::
             map<unsigned_long,_OSAttribute,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute>_>_>
             ::end((map<unsigned_long,_OSAttribute,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute>_>_>
                    *)CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8));
        bVar1 = std::operator!=((_Self *)local_148,&local_150);
        if (!bVar1) break;
        this_00 = (OSAttribute *)local_148;
        std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_OSAttribute>_>::operator->
                  ((_Rb_tree_const_iterator<std::pair<const_unsigned_long,_OSAttribute>_> *)0x15bc2b
                  );
        OSAttribute::OSAttribute
                  (this_00,(OSAttribute *)
                           CONCAT17(in_stack_fffffffffffffd2f,
                                    CONCAT16(in_stack_fffffffffffffd2e,
                                             CONCAT15(in_stack_fffffffffffffd2d,
                                                      CONCAT14(in_stack_fffffffffffffd2c,
                                                               CONCAT13(in_stack_fffffffffffffd2b,
                                                                        CONCAT12(
                                                  in_stack_fffffffffffffd2a,
                                                  in_stack_fffffffffffffd28)))))));
        std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_OSAttribute>_>::operator->
                  ((_Rb_tree_const_iterator<std::pair<const_unsigned_long,_OSAttribute>_> *)0x15bc49
                  );
        bVar1 = writeULong((File *)in_stack_fffffffffffffd68,
                           CONCAT17(in_stack_fffffffffffffd67,
                                    CONCAT16(in_stack_fffffffffffffd66,in_stack_fffffffffffffd60)));
        if (bVar1) {
          in_stack_fffffffffffffd2f = OSAttribute::isBooleanAttribute(&local_1f0);
          if ((bool)in_stack_fffffffffffffd2f) {
            in_stack_fffffffffffffd2e =
                 writeULong((File *)in_stack_fffffffffffffd68,
                            CONCAT17(in_stack_fffffffffffffd67,
                                     CONCAT16(in_stack_fffffffffffffd66,in_stack_fffffffffffffd60)))
            ;
            if ((bool)in_stack_fffffffffffffd2e) {
              in_stack_fffffffffffffd2d = OSAttribute::getBooleanValue(&local_1f0);
              in_stack_fffffffffffffd2c =
                   writeBool((File *)CONCAT17(in_stack_fffffffffffffd0f,
                                              CONCAT16(in_stack_fffffffffffffd0e,
                                                       CONCAT15(in_stack_fffffffffffffd0d,
                                                                in_stack_fffffffffffffd08))),
                             SUB81((ulong)in_stack_fffffffffffffd00 >> 0x38,0));
              if ((bool)in_stack_fffffffffffffd2c) goto LAB_0015c07e;
              local_1 = 0;
              local_148._12_4_ = 1;
            }
            else {
              local_1 = 0;
              local_148._12_4_ = 1;
            }
          }
          else {
            in_stack_fffffffffffffd2b = OSAttribute::isUnsignedLongAttribute(&local_1f0);
            if ((bool)in_stack_fffffffffffffd2b) {
              in_stack_fffffffffffffd2a =
                   writeULong((File *)in_stack_fffffffffffffd68,
                              CONCAT17(in_stack_fffffffffffffd67,
                                       CONCAT16(in_stack_fffffffffffffd66,in_stack_fffffffffffffd60)
                                      ));
              if ((bool)in_stack_fffffffffffffd2a) {
                OSAttribute::getUnsignedLongValue(&local_1f0);
                in_stack_fffffffffffffd1f =
                     writeULong((File *)in_stack_fffffffffffffd68,
                                CONCAT17(in_stack_fffffffffffffd67,
                                         CONCAT16(in_stack_fffffffffffffd66,
                                                  in_stack_fffffffffffffd60)));
                if ((bool)in_stack_fffffffffffffd1f) goto LAB_0015c07e;
                local_1 = 0;
                local_148._12_4_ = 1;
              }
              else {
                local_1 = 0;
                local_148._12_4_ = 1;
              }
            }
            else {
              uVar2 = OSAttribute::isByteStringAttribute(&local_1f0);
              if ((bool)uVar2) {
                in_stack_fffffffffffffd1d =
                     writeULong((File *)in_stack_fffffffffffffd68,
                                CONCAT17(in_stack_fffffffffffffd67,
                                         CONCAT16(in_stack_fffffffffffffd66,
                                                  in_stack_fffffffffffffd60)));
                if ((bool)in_stack_fffffffffffffd1d) {
                  in_stack_fffffffffffffd10 = OSAttribute::getByteStringValue(&local_1f0);
                  ByteString::ByteString
                            (in_stack_fffffffffffffd10,
                             (ByteString *)
                             CONCAT17(in_stack_fffffffffffffd0f,
                                      CONCAT16(in_stack_fffffffffffffd0e,
                                               CONCAT15(in_stack_fffffffffffffd0d,
                                                        in_stack_fffffffffffffd08))));
                  in_stack_fffffffffffffd0f =
                       writeByteString((File *)in_stack_fffffffffffffd68,
                                       (ByteString *)
                                       CONCAT17(in_stack_fffffffffffffd67,
                                                CONCAT16(in_stack_fffffffffffffd66,
                                                         in_stack_fffffffffffffd60)));
                  if (!(bool)in_stack_fffffffffffffd0f) {
                    local_1 = 0;
                  }
                  local_148._13_3_ = 0;
                  local_148[0xc] = !(bool)in_stack_fffffffffffffd0f;
                  ByteString::~ByteString((ByteString *)0x15bf4d);
joined_r0x0015bf56:
                  if (local_148._12_4_ == 0) goto LAB_0015c07e;
                }
                else {
                  local_1 = 0;
                  local_148._12_4_ = 1;
                }
              }
              else {
                in_stack_fffffffffffffd0e = OSAttribute::isMechanismTypeSetAttribute(&local_1f0);
                if ((bool)in_stack_fffffffffffffd0e) {
                  in_stack_fffffffffffffd0d =
                       writeULong((File *)in_stack_fffffffffffffd68,
                                  CONCAT17(in_stack_fffffffffffffd67,
                                           CONCAT16(in_stack_fffffffffffffd66,
                                                    in_stack_fffffffffffffd60)));
                  if ((bool)in_stack_fffffffffffffd0d) {
                    in_stack_fffffffffffffd00 =
                         (OSAttribute *)OSAttribute::getMechanismTypeSetValue(&local_1f0);
                    std::
                    set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
                    set((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                         *)in_stack_fffffffffffffd00,
                        (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                         *)CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8));
                    in_stack_fffffffffffffcff =
                         writeMechanismTypeSet
                                   ((File *)CONCAT17(in_stack_fffffffffffffd1f,
                                                     CONCAT16(uVar2,CONCAT15(
                                                  in_stack_fffffffffffffd1d,
                                                  in_stack_fffffffffffffd18))),
                                    (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                                     *)in_stack_fffffffffffffd10);
                    if (!(bool)in_stack_fffffffffffffcff) {
                      local_1 = 0;
                    }
                    local_148._13_3_ = 0;
                    local_148[0xc] = !(bool)in_stack_fffffffffffffcff;
                    std::
                    set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
                    ~set((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                          *)0x15c069);
                    goto joined_r0x0015bf56;
                  }
                  local_1 = 0;
                  local_148._12_4_ = 1;
                }
                else {
LAB_0015c07e:
                  local_148._12_4_ = 0;
                }
              }
            }
          }
        }
        else {
          local_1 = 0;
          local_148._12_4_ = 1;
        }
        OSAttribute::~OSAttribute(in_stack_fffffffffffffd00);
        if (local_148._12_4_ != 0) goto LAB_0015c0d0;
        std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_OSAttribute>_>::operator++
                  ((_Rb_tree_const_iterator<std::pair<const_unsigned_long,_OSAttribute>_> *)
                   in_stack_fffffffffffffd00);
      }
      local_1 = 1;
    }
    else {
      local_1 = 0;
    }
  }
LAB_0015c0d0:
  return (bool)(local_1 & 1);
}

Assistant:

bool File::writeAttributeMap(const std::map<CK_ATTRIBUTE_TYPE,OSAttribute>& value)
{
	if (!valid) return false;

	// compute length
	unsigned long len = 0;
	for (std::map<CK_ATTRIBUTE_TYPE,OSAttribute>::const_iterator i = value.begin(); i != value.end(); ++i)
	{
		OSAttribute attr = i->second;
		// count attribute type and kind
		len += 8 + 8;

		if (attr.isBooleanAttribute())
		{
			len += 1;
		}
		else if (attr.isUnsignedLongAttribute())
		{
			len += 8;
		}
		else if (attr.isByteStringAttribute())
		{
			ByteString val = attr.getByteStringValue();
			len += 8 + val.size();
		}
		else if (attr.isMechanismTypeSetAttribute())
		{
			std::set<CK_MECHANISM_TYPE> val = attr.getMechanismTypeSetValue();
			len += 8 + val.size() * 8;
		}
		else
		{
			return false;
		}
	}

	// write length
	if (!writeULong(len))
	{
		return false;
	}

	// write each attribute
	for (std::map<CK_ATTRIBUTE_TYPE,OSAttribute>::const_iterator i = value.begin(); i != value.end(); ++i)
	{
		OSAttribute attr = i->second;
		unsigned long attrType = (unsigned long) i->first;
		if (!writeULong(attrType))
		{
			return false;
		}

		if (attr.isBooleanAttribute())
		{
			unsigned long attrKind = akBoolean;
			if (!writeULong(attrKind))
			{
				return false;
			}

			bool val = attr.getBooleanValue();
			if (!writeBool(val))
			{
				return false;
			}
		}
		else if (attr.isUnsignedLongAttribute())
		{
			unsigned long attrKind = akInteger;
			if (!writeULong(attrKind))
			{
				return false;
			}

			unsigned long val = attr.getUnsignedLongValue();
			if (!writeULong(val))
			{
				return false;
			}
		}
		else if (attr.isByteStringAttribute())
		{
			unsigned long attrKind = akBinary;
			if (!writeULong(attrKind))
			{
				return false;
			}

			ByteString val = attr.getByteStringValue();
			if (!writeByteString(val))
			{
				return false;
			}
		}
		else if (attr.isMechanismTypeSetAttribute())
		{
			unsigned long attrKind = akMechSet;
			if (!writeULong(attrKind))
			{
				return false;
			}

			std::set<CK_MECHANISM_TYPE> val = attr.getMechanismTypeSetValue();
			if (!writeMechanismTypeSet(val))
			{
				return false;
			}
		}
	}

	return true;
}